

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O2

spvc_variable_id spvc_compiler_hlsl_remap_num_workgroups_builtin(spvc_compiler compiler)

{
  spvc_context_s *this;
  VariableID VVar1;
  allocator local_31;
  string local_30;
  
  if (compiler->backend == SPVC_BACKEND_HLSL) {
    VVar1 = spirv_cross::CompilerHLSL::remap_num_workgroups_builtin
                      ((CompilerHLSL *)
                       (compiler->compiler)._M_t.
                       super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
                       .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl);
    return VVar1.id;
  }
  this = compiler->context;
  std::__cxx11::string::string
            ((string *)&local_30,"HLSL function used on a non-HLSL backend.",&local_31);
  spvc_context_s::report_error(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return 0;
}

Assistant:

spvc_variable_id spvc_compiler_hlsl_remap_num_workgroups_builtin(spvc_compiler compiler)
{
#if SPIRV_CROSS_C_API_HLSL
	if (compiler->backend != SPVC_BACKEND_HLSL)
	{
		compiler->context->report_error("HLSL function used on a non-HLSL backend.");
		return 0;
	}

	auto &hlsl = *static_cast<CompilerHLSL *>(compiler->compiler.get());
	return hlsl.remap_num_workgroups_builtin();
#else
	compiler->context->report_error("HLSL function used on a non-HLSL backend.");
	return 0;
#endif
}